

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O0

double __thiscall
imrt::ApertureILS::closeBeamlet
          (ApertureILS *this,int beamlet,int side,int aperture,Station *station,double c_eval,
          Plan *P)

{
  size_type sVar1;
  int in_EDX;
  _Base_ptr in_XMM0_Qa;
  double dVar2;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  double r_eval;
  double l_eval;
  double aux_eval;
  int in_stack_fffffffffffffe1c;
  Station *in_stack_fffffffffffffe20;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff_00;
  Station *in_stack_fffffffffffffe28;
  Station *station_00;
  Plan *in_stack_fffffffffffffe30;
  double in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  int b;
  Station *in_stack_fffffffffffffe48;
  Station *in_stack_fffffffffffffe50;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_138 [4];
  Station *in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff6f;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  Station *in_stack_ffffffffffffff78;
  undefined1 local_68 [32];
  _Base_ptr local_48;
  _Base_ptr local_40;
  _Base_ptr local_30;
  int local_18;
  _Base_ptr local_8;
  
  b = (int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  local_30 = in_XMM0_Qa;
  local_18 = in_EDX;
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x15f1ca);
  Station::getApertureIntensity(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
  dVar2 = Plan::get_delta_eval
                    ((Plan *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,b,
                     in_stack_fffffffffffffe38,(int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
  if (dVar2 <= (double)local_30) {
    if (local_18 == 1) {
      Station::closeBeamlet_abi_cxx11_
                (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                 (bool)in_stack_ffffffffffffff6f);
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                in_stack_fffffffffffffe30,
                (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                in_stack_fffffffffffffe28);
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x15f315)
      ;
      sVar1 = std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              size((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   in_stack_fffffffffffffe20);
      if (sVar1 != 0) {
        local_30 = (_Base_ptr)
                   Plan::incremental_eval
                             (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                              (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               *)in_stack_fffffffffffffe20);
      }
    }
    else if (local_18 == 2) {
      Station::closeBeamlet_abi_cxx11_
                (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                 (bool)in_stack_ffffffffffffff6f);
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                in_stack_fffffffffffffe30,
                (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                in_stack_fffffffffffffe28);
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x15f3bf)
      ;
      sVar1 = std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              size((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   in_stack_fffffffffffffe20);
      if (sVar1 != 0) {
        local_30 = (_Base_ptr)
                   Plan::incremental_eval
                             (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                              (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               *)in_stack_fffffffffffffe20);
      }
    }
    else {
      local_48 = local_30;
      Station::closeBeamlet_abi_cxx11_
                (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                 (bool)in_stack_ffffffffffffff6f);
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                in_stack_fffffffffffffe30,
                (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                in_stack_fffffffffffffe28);
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x15f46a)
      ;
      sVar1 = std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              size((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   in_stack_fffffffffffffe20);
      if (sVar1 != 0) {
        local_48 = (_Base_ptr)
                   Plan::incremental_eval
                             (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                              (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               *)in_stack_fffffffffffffe20);
        Station::undoLast_abi_cxx11_(in_stack_ffffffffffffff38);
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffe30,
                  (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffe28);
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   0x15f4f5);
        local_40 = (_Base_ptr)
                   Plan::incremental_eval
                             (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                              (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               *)in_stack_fffffffffffffe20);
      }
      local_68._24_8_ = local_30;
      Station::closeBeamlet_abi_cxx11_
                (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                 (bool)in_stack_ffffffffffffff6f);
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                in_stack_fffffffffffffe30,
                (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                in_stack_fffffffffffffe28);
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x15f582)
      ;
      sVar1 = std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              size((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   in_stack_fffffffffffffe20);
      if (sVar1 != 0) {
        local_68._24_8_ =
             Plan::incremental_eval
                       (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                        (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                        in_stack_fffffffffffffe20);
        Station::undoLast_abi_cxx11_(in_stack_ffffffffffffff38);
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffe30,
                  (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffe28);
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   0x15f60d);
        local_40 = (_Base_ptr)
                   Plan::incremental_eval
                             (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                              (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               *)in_stack_fffffffffffffe20);
      }
      if ((double)local_68._24_8_ <= (double)local_48) {
        Station::closeBeamlet_abi_cxx11_
                  (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                   (bool)in_stack_ffffffffffffff6f);
        station_00 = (Station *)local_68;
        diff_00 = local_138;
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffe30,
                  (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  station_00);
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   0x15f731);
        local_30 = (_Base_ptr)Plan::incremental_eval(in_stack_fffffffffffffe30,station_00,diff_00);
      }
      else {
        Station::closeBeamlet_abi_cxx11_
                  (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                   (bool)in_stack_ffffffffffffff6f);
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffe30,
                  (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffe28);
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   0x15f6aa);
        local_30 = (_Base_ptr)
                   Plan::incremental_eval
                             (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                              (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               *)in_stack_fffffffffffffe20);
      }
    }
  }
  else {
    Station::clearHistory(in_stack_fffffffffffffe50);
  }
  local_8 = local_30;
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x15f790);
  return (double)local_8;
}

Assistant:

double ApertureILS::closeBeamlet(int beamlet, int side, int aperture, Station& station, double c_eval, Plan& P) {
  double aux_eval, l_eval, r_eval;
  list <pair<int, double> > diff;
  
  if (P.get_delta_eval(station, beamlet, -station.getApertureIntensity(aperture)) > c_eval){
    station.clearHistory();
    return(c_eval);
  }
  
  if (side == 1) {
    diff = station.closeBeamlet(beamlet, aperture, true);
    if (diff.size() > 0) {
      c_eval = P.incremental_eval(station, diff);
    } 
  } else if (side==2) {
    diff = station.closeBeamlet(beamlet, aperture, false);
    if (diff.size() > 0) {
      c_eval = P.incremental_eval(station, diff);
    }
  } else {
    l_eval = c_eval;
    diff = station.closeBeamlet(beamlet, aperture, true);
    if (diff.size() > 0) {
      l_eval = P.incremental_eval(station, diff);
      diff = station.undoLast();
      aux_eval = P.incremental_eval(station, diff);
    }
    r_eval = c_eval;
    diff = station.closeBeamlet(beamlet, aperture, false);
    if (diff.size() > 0) {
      r_eval = P.incremental_eval(station, diff);
      diff = station.undoLast();
      aux_eval = P.incremental_eval(station, diff);
    }
    
    if (r_eval > l_eval){
      diff = station.closeBeamlet(beamlet, aperture, true);
      c_eval = P.incremental_eval(station, diff);
    } else {
      diff = station.closeBeamlet(beamlet, aperture, false);
      c_eval = P.incremental_eval(station, diff);
    }
  }
  return(c_eval);
}